

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

Privkey * cfd::core::ConfidentialTransaction::GetIssuanceBlindingKey
                    (Privkey *__return_storage_ptr__,Privkey *master_blinding_key,Txid *txid,
                    uint32_t vout)

{
  ByteData local_110;
  ByteData local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  undefined1 local_c8 [8];
  ByteData256 data;
  Script script;
  int64_t vout64;
  undefined1 local_48 [8];
  ScriptBuilder builder;
  uint32_t vout_local;
  Txid *txid_local;
  Privkey *master_blinding_key_local;
  
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = vout;
  ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_48);
  ScriptBuilder::AppendOperator
            ((ScriptBuilder *)local_48,(ScriptOperator *)ScriptOperator::OP_RETURN);
  Txid::GetData((ByteData *)&vout64,txid);
  ScriptBuilder::AppendData((ScriptBuilder *)local_48,(ByteData *)&vout64);
  ByteData::~ByteData((ByteData *)&vout64);
  script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(ulong)builder.script_byte_array_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
  ScriptBuilder::AppendData
            ((ScriptBuilder *)local_48,
             (int64_t *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ScriptBuilder::Build
            ((Script *)
             &data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ScriptBuilder *)local_48);
  Privkey::GetData(&local_f8,master_blinding_key);
  ByteData::GetBytes(&local_e0,&local_f8);
  Script::GetData(&local_110,
                  (Script *)
                  &data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  CryptoUtil::HmacSha256((ByteData256 *)local_c8,&local_e0,&local_110);
  ByteData::~ByteData(&local_110);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0);
  ByteData::~ByteData(&local_f8);
  Privkey::Privkey(__return_storage_ptr__,(ByteData256 *)local_c8,kMainnet,true);
  ByteData256::~ByteData256((ByteData256 *)local_c8);
  Script::~Script((Script *)
                  &data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Privkey ConfidentialTransaction::GetIssuanceBlindingKey(
    const Privkey &master_blinding_key, const Txid &txid, uint32_t vout) {
  // script: OP_RETURN <txid> <vout>
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_RETURN);
  builder.AppendData(txid.GetData());
  int64_t vout64 = vout;
  builder.AppendData(vout64);
  Script script = builder.Build();

  ByteData256 data = CryptoUtil::HmacSha256(
      master_blinding_key.GetData().GetBytes(), script.GetData());
  return Privkey(data);
}